

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O1

int ffeopn(fitsfile **fptr,char *name,int mode,char *extlist,int *hdutype,int *status)

{
  int iVar1;
  size_t sVar2;
  char *__dest;
  char *hduname;
  int thdutype;
  int naxis;
  int hdunum;
  int local_34;
  int local_30;
  int local_2c;
  
  local_30 = 0;
  iVar1 = *status;
  if (iVar1 < 1) {
    iVar1 = ffopen(fptr,name,mode,status);
    if (iVar1 < 1) {
      ffghdn(*fptr,&local_2c);
      ffghdt(*fptr,&local_34,status);
      if ((local_2c == 1) && (local_34 == 0)) {
        ffgidm(*fptr,&local_30,status);
      }
      if ((local_2c == 1) && (local_30 == 0)) {
        if (extlist != (char *)0x0) {
          sVar2 = strlen(extlist);
          __dest = (char *)malloc(sVar2 + 1);
          if (__dest == (char *)0x0) {
            *status = 0x71;
            return 0x71;
          }
          strcpy(__dest,extlist);
          hduname = strtok(__dest," ");
          while (hduname != (char *)0x0) {
            ffmnhd(*fptr,-1,hduname,0,status);
            if (*status == 0) {
              free(__dest);
              goto LAB_0010bb70;
            }
            *status = 0;
            hduname = strtok((char *)0x0," ");
          }
          free(__dest);
        }
        ffmahd(*fptr,2,&local_34,status);
      }
LAB_0010bb70:
      if (hdutype != (int *)0x0) {
        ffghdt(*fptr,hdutype,status);
      }
    }
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffeopn(fitsfile **fptr,      /* O - FITS file pointer                   */ 
           const char *name,     /* I - full name of file to open           */
           int mode,             /* I - 0 = open readonly; 1 = read/write   */
           char *extlist,        /* I - list of 'good' extensions to move to */
           int *hdutype,         /* O - type of extension that is moved to  */
           int *status)          /* IO - error status                       */
/*
  Open an existing FITS file with either readonly or read/write access. and
  if the primary array contains a null image (i.e., NAXIS = 0) then attempt to
  move to the first extension named in the extlist of extension names. If
  none are found, then simply move to the 2nd extension.
*/
{
    int hdunum, naxis = 0, thdutype, gotext=0;
    char *ext, *textlist;
    char *saveptr;
  
    if (*status > 0)
        return(*status);

    if (ffopen(fptr, name, mode, status) > 0)
        return(*status);

    fits_get_hdu_num(*fptr, &hdunum);
    fits_get_hdu_type(*fptr, &thdutype, status);
    if (hdunum == 1 && thdutype == IMAGE_HDU) {
      fits_get_img_dim(*fptr, &naxis, status);
    }

    /* We are in the "default" primary extension */
    /* look through the extension list */
    if( (hdunum == 1) && (naxis == 0) ){ 
      if( extlist ){
        gotext = 0;
	textlist = malloc(strlen(extlist) + 1);
	if (!textlist) {
	    *status = MEMORY_ALLOCATION;
	    return(*status);
	}

        strcpy(textlist, extlist);
        for(ext=(char *)ffstrtok(textlist, " ",&saveptr); ext != NULL; 
	    ext=(char *)ffstrtok(NULL," ",&saveptr)){
	    fits_movnam_hdu(*fptr, ANY_HDU, ext, 0, status);
	    if( *status == 0 ){
	      gotext = 1;
	      break;
	    } else {
	      *status = 0;
	    }
        }
        free(textlist);      
      }
      if( !gotext ){
        /* if all else fails, move to extension #2 and hope for the best */
        fits_movabs_hdu(*fptr, 2, &thdutype, status);
      }
    }
    if (hdutype) {
      fits_get_hdu_type(*fptr, hdutype, status);
    }
    return(*status);
}